

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void init_proc_401(CPUPPCState_conflict2 *env)

{
  PowerPCCPU_conflict3 *cpu;
  CPUPPCState_conflict2 *env_local;
  
  gen_spr_40x(env);
  gen_spr_401_403(env);
  gen_spr_401(env);
  init_excp_4xx_real(env);
  env->dcache_line_size = 0x20;
  env->icache_line_size = 0x20;
  cpu = (PowerPCCPU_conflict3 *)env_archcpu((CPUArchState_conflict22 *)env);
  ppc40x_irq_init_ppc64(cpu);
  builtin_memcpy(env->fit_period,"\f\x10\x14\x18",4);
  builtin_memcpy(env->wdt_period,"\x10\x14\x18\x1c",4);
  return;
}

Assistant:

static void init_proc_401(CPUPPCState *env)
{
    gen_spr_40x(env);
    gen_spr_401_403(env);
    gen_spr_401(env);
    init_excp_4xx_real(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc40x_irq_init(env_archcpu(env));

    SET_FIT_PERIOD(12, 16, 20, 24);
    SET_WDT_PERIOD(16, 20, 24, 28);
}